

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O0

void class_test(char *filename,FILE *fp)

{
  bool bVar1;
  byte bVar2;
  _Bool _Var3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  uint local_10c;
  uint type_1;
  char *word_1;
  char *pcStack_f8;
  _Bool test_ok;
  char *p;
  char *pcStack_e8;
  uint bitmask;
  char *semicolon;
  char *word;
  char *p_1;
  char *line;
  uint type;
  uint uc;
  size_t i;
  uint representatives [23];
  uint *local_50;
  uint *order;
  size_t order_len;
  size_t order_size;
  bidi_char *bcs;
  size_t bcs_len;
  size_t bcs_size;
  FILE *pFStack_18;
  uint lineno;
  FILE *fp_local;
  char *filename_local;
  
  bcs_size._4_4_ = 0;
  bcs_len = 0;
  bcs = (bidi_char *)0x0;
  order_size = 0;
  order_len = 0;
  order = (uint *)0x0;
  local_50 = (uint *)0x0;
  for (_type = 0; _type < 0x17; _type = _type + 1) {
    representatives[_type - 2] = 0;
  }
  pFStack_18 = fp;
  fp_local = (FILE *)filename;
  for (line._4_4_ = L'\x01'; (uint)line._4_4_ < 0x110000; line._4_4_ = line._4_4_ + L'\x01') {
    bVar2 = bidi_getType(line._4_4_);
    line._0_4_ = (uint)bVar2;
    if ((representatives[(ulong)(uint)line - 2] == 0) ||
       ((iVar4 = mk_wcwidth(representatives[(ulong)(uint)line - 2]), iVar4 < 1 &&
        (iVar4 = mk_wcwidth(line._4_4_), 0 < iVar4)))) {
      representatives[(ulong)(uint)line - 2] = line._4_4_;
    }
  }
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            bcs_size._4_4_ = bcs_size._4_4_ + 1;
            pcVar5 = fgetline(pFStack_18);
            p_1 = chomp(pcVar5);
            if (p_1 == (char *)0x0) {
              safefree((void *)order_size);
              safefree(local_50);
              return;
            }
            if ((*p_1 != '\0') && (*p_1 != '#')) break;
            safefree(p_1);
          }
          _Var3 = strstartswith(p_1,"@Reorder:");
          if (!_Var3) break;
          word = p_1;
          extract_word(&word);
          order = (uint *)0x0;
          while (semicolon = extract_word(&word), *semicolon != '\0') {
            local_50 = (uint *)safegrowarray(local_50,&order_len,4,(size_t)order,1,false);
            uVar6 = strtoul(semicolon,(char **)0x0,0);
            local_50[(long)order] = (uint)uVar6;
            order = (uint *)((long)order + 1);
          }
          safefree(p_1);
        }
        _Var3 = strstartswith(p_1,"@Levels:");
        if (!_Var3) break;
        safefree(p_1);
      }
      pcVar5 = strchr(p_1,0x3b);
      if (pcVar5 != (char *)0x0) break;
      pcStack_e8 = pcVar5;
      printf("%s:%u: bad test line\': no bitmap\n",fp_local,(ulong)bcs_size._4_4_);
      safefree(p_1);
    }
    pcStack_e8 = pcVar5 + 1;
    *pcVar5 = '\0';
    uVar6 = strtoul(pcStack_e8,(char **)0x0,0);
    p._4_4_ = (uint)uVar6;
    pcStack_f8 = p_1;
    bcs = (bidi_char *)0x0;
    bVar1 = true;
    while (pcVar5 = extract_word(&stack0xffffffffffffff08), *pcVar5 != '\0') {
      local_10c = 0;
      while ((local_10c < 0x17 && (iVar4 = strcmp(pcVar5,typenames[local_10c]), iVar4 != 0))) {
        local_10c = local_10c + 1;
      }
      if (local_10c == 0x17) {
        printf("%s:%u: bad test line: bad bidi type \'%s\'\n",fp_local,(ulong)bcs_size._4_4_,pcVar5)
        ;
        bVar1 = false;
        break;
      }
      order_size = (size_t)safegrowarray((void *)order_size,&bcs_len,0xc,(size_t)bcs,1,false);
      *(uint *)(order_size + (long)bcs * 0xc + 4) = representatives[(ulong)local_10c - 2];
      *(undefined4 *)(order_size + (long)bcs * 0xc) =
           *(undefined4 *)(order_size + (long)bcs * 0xc + 4);
      *(short *)(order_size + (long)bcs * 0xc + 8) = (short)bcs;
      *(undefined2 *)(order_size + (long)bcs * 0xc + 10) = 1;
      bcs = (bidi_char *)((long)&bcs->origwc + 1);
    }
    if (bVar1) {
      if ((p._4_4_ & 1) != 0) {
        run_test((char *)fp_local,bcs_size._4_4_,(bidi_char *)order_size,(size_t)bcs,local_50,
                 (size_t)order,0);
      }
      if ((p._4_4_ & 2) != 0) {
        run_test((char *)fp_local,bcs_size._4_4_,(bidi_char *)order_size,(size_t)bcs,local_50,
                 (size_t)order,1);
      }
      if ((p._4_4_ & 4) != 0) {
        run_test((char *)fp_local,bcs_size._4_4_,(bidi_char *)order_size,(size_t)bcs,local_50,
                 (size_t)order,-1);
      }
      safefree(p_1);
    }
    else {
      safefree(p_1);
    }
  } while( true );
}

Assistant:

static void class_test(const char *filename, FILE *fp)
{
    unsigned lineno = 0;
    size_t bcs_size = 0, bcs_len = 0;
    bidi_char *bcs = NULL;
    size_t order_size = 0, order_len = 0;
    unsigned *order = NULL;

    /* Preliminary: find a representative character of every bidi
     * type. Prefer positive-width ones if available. */
    unsigned representatives[N_BIDI_TYPES];
    for (size_t i = 0; i < N_BIDI_TYPES; i++)
        representatives[i] = 0;
    for (unsigned uc = 1; uc < 0x110000; uc++) {
        unsigned type = bidi_getType(uc);
        if (!representatives[type] ||
            (mk_wcwidth(representatives[type]) <= 0 && mk_wcwidth(uc) > 0))
            representatives[type] = uc;
    }

    while (true) {
        lineno++;
        char *line = chomp(fgetline(fp));
        if (!line)
            break;

        /* Skip blank lines and comments */
        if (!line[0] || line[0] == '#') {
            sfree(line);
            continue;
        }

        /* Parse @Reorder lines, which tell us the expected output
         * order for all following test cases (until superseded) */
        if (strstartswith(line, "@Reorder:")) {
            char *p = line;
            extract_word(&p); /* eat the "@Reorder:" header itself */
            order_len = 0;
            while (1) {
                const char *word = extract_word(&p);
                if (!*word)
                    break;
                sgrowarray(order, order_size, order_len);
                order[order_len++] = strtoul(word, NULL, 0);
            }

            sfree(line);
            continue;
        }

        /* Skip @Levels lines, which we don't (yet?) do anything with */
        if (strstartswith(line, "@Levels:")) {
            sfree(line);
            continue;
        }

        /* Everything remaining should be an actual test */
        char *semicolon = strchr(line, ';');
        if (!semicolon) {
            printf("%s:%u: bad test line': no bitmap\n", filename, lineno);
            sfree(line);
            continue;
        }
        *semicolon++ = '\0';
        unsigned bitmask = strtoul(semicolon, NULL, 0);
        char *p = line;
        bcs_len = 0;
        bool test_ok = true;
        while (1) {
            const char *word = extract_word(&p);
            if (!*word)
                break;
            unsigned type;
            for (type = 0; type < N_BIDI_TYPES; type++)
                if (!strcmp(word, typenames[type]))
                    break;
            if (type == N_BIDI_TYPES) {
                printf("%s:%u: bad test line: bad bidi type '%s'\n",
                       filename, lineno, word);
                test_ok = false;
                break;
            }
            sgrowarray(bcs, bcs_size, bcs_len);
            bcs[bcs_len].wc = representatives[type];
            bcs[bcs_len].origwc = bcs[bcs_len].wc;
            bcs[bcs_len].index = bcs_len;
            bcs[bcs_len].nchars = 1;
            bcs_len++;
        }

        if (!test_ok) {
            sfree(line);
            continue;
        }

        if (bitmask & 1)
            run_test(filename, lineno, bcs, bcs_len, order, order_len, 0);
        if (bitmask & 2)
            run_test(filename, lineno, bcs, bcs_len, order, order_len, +1);
        if (bitmask & 4)
            run_test(filename, lineno, bcs, bcs_len, order, order_len, -1);

        sfree(line);
    }

    sfree(bcs);
    sfree(order);
}